

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O3

void RDL_deleteGraph(RDL_graph *gra)

{
  uint uVar1;
  uint **__ptr;
  ulong uVar2;
  
  if (gra != (RDL_graph *)0x0) {
    __ptr = gra->edges;
    if (__ptr != (uint **)0x0) {
      if (gra->E != 0) {
        uVar2 = 0;
        do {
          free(gra->edges[uVar2]);
          uVar2 = uVar2 + 1;
        } while (uVar2 < gra->E);
        __ptr = gra->edges;
      }
      free(__ptr);
    }
    uVar1 = gra->V;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (gra->degree[uVar2] != 0) {
          free(gra->adjList[uVar2]);
          uVar1 = gra->V;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < uVar1);
    }
    free(gra->adjList);
    free(gra->degree);
    free(gra);
    return;
  }
  __assert_fail("gra != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLgraph.c"
                ,0x78,"void RDL_deleteGraph(RDL_graph *)");
}

Assistant:

void RDL_deleteGraph(RDL_graph *gra)
{
  unsigned i;
  assert(gra != NULL);
  if(gra->edges)
  {
    for(i=0; i<gra->E; ++i)
    {
      free(gra->edges[i]);
    }
    free(gra->edges);
  }
  for(i=0; i<gra->V; ++i)
  {
    if(gra->degree[i] > 0)
    {
      free(gra->adjList[i]);
    }
  }
  free(gra->adjList);
  free(gra->degree);
  free(gra);
}